

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem *items,int count,float width_excess)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  float *pfVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  if (count != 0) {
    uVar1 = (ulong)(uint)count;
    if (count == 1) {
      if (0.0 <= items->Width) {
        fVar6 = items->Width - width_excess;
        if (fVar6 <= 1.0) {
          fVar6 = 1.0;
        }
        items->Width = fVar6;
      }
    }
    else {
      qsort(items,(long)count,0xc,ShrinkWidthItemComparer);
      if ((1 < count) && (0.0 < width_excess)) {
        uVar3 = 1;
        do {
          fVar6 = items->Width;
          uVar3 = (ulong)(int)uVar3;
          pfVar4 = &items[uVar3].Width;
          do {
            fVar8 = *pfVar4;
            if (fVar8 < fVar6) {
              if (0.0 <= fVar8) {
                fVar6 = fVar6 - fVar8;
                goto LAB_0020f27d;
              }
              break;
            }
            uVar3 = uVar3 + 1;
            pfVar4 = pfVar4 + 3;
          } while ((long)uVar3 < (long)uVar1);
          fVar6 = fVar6 + -1.0;
LAB_0020f27d:
          if (fVar6 <= 0.0) break;
          iVar2 = (int)uVar3;
          fVar8 = width_excess / (float)iVar2;
          if (fVar6 <= fVar8) {
            fVar8 = fVar6;
          }
          if (0 < iVar2) {
            lVar5 = 0;
            do {
              *(float *)((long)&items->Width + lVar5) =
                   *(float *)((long)&items->Width + lVar5) - fVar8;
              lVar5 = lVar5 + 0xc;
            } while ((uVar3 & 0xffffffff) * 0xc != lVar5);
          }
          if ((count <= iVar2) ||
             (width_excess = width_excess - fVar8 * (float)iVar2, width_excess <= 0.0)) break;
        } while( true );
      }
      if (0 < count) {
        fVar6 = 0.0;
        lVar5 = 0;
        do {
          fVar8 = *(float *)((long)&items->Width + lVar5);
          fVar7 = (float)(int)fVar8;
          fVar6 = fVar6 + (fVar8 - fVar7);
          *(float *)((long)&items->Width + lVar5) = fVar7;
          lVar5 = lVar5 + 0xc;
        } while (uVar1 * 0xc != lVar5);
        if (0.0 < fVar6) {
          do {
            if ((0 < count) && (0.0 < fVar6)) {
              uVar3 = 1;
              pfVar4 = &items->Width;
              do {
                fVar8 = pfVar4[1] - *pfVar4;
                if (1.0 <= fVar8) {
                  fVar8 = 1.0;
                }
                *pfVar4 = *pfVar4 + fVar8;
                fVar6 = fVar6 - fVar8;
                if (uVar1 <= uVar3) break;
                pfVar4 = pfVar4 + 3;
                uVar3 = uVar3 + 1;
              } while (0.0 < fVar6);
            }
          } while (0.0 < fVar6);
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem* items, int count, float width_excess)
{
    if (count == 1)
    {
        if (items[0].Width >= 0.0f)
            items[0].Width = ImMax(items[0].Width - width_excess, 1.0f);
        return;
    }
    ImQsort(items, (size_t)count, sizeof(ImGuiShrinkWidthItem), ShrinkWidthItemComparer);
    int count_same_width = 1;
    while (width_excess > 0.0f && count_same_width < count)
    {
        while (count_same_width < count && items[0].Width <= items[count_same_width].Width)
            count_same_width++;
        float max_width_to_remove_per_item = (count_same_width < count && items[count_same_width].Width >= 0.0f) ? (items[0].Width - items[count_same_width].Width) : (items[0].Width - 1.0f);
        if (max_width_to_remove_per_item <= 0.0f)
            break;
        float width_to_remove_per_item = ImMin(width_excess / count_same_width, max_width_to_remove_per_item);
        for (int item_n = 0; item_n < count_same_width; item_n++)
            items[item_n].Width -= width_to_remove_per_item;
        width_excess -= width_to_remove_per_item * count_same_width;
    }

    // Round width and redistribute remainder
    // Ensure that e.g. the right-most tab of a shrunk tab-bar always reaches exactly at the same distance from the right-most edge of the tab bar separator.
    width_excess = 0.0f;
    for (int n = 0; n < count; n++)
    {
        float width_rounded = ImFloor(items[n].Width);
        width_excess += items[n].Width - width_rounded;
        items[n].Width = width_rounded;
    }
    while (width_excess > 0.0f)
        for (int n = 0; n < count && width_excess > 0.0f; n++)
        {
            float width_to_add = ImMin(items[n].InitialWidth - items[n].Width, 1.0f);
            items[n].Width += width_to_add;
            width_excess -= width_to_add;
        }
}